

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O1

void __thiscall r_exec::AntiPGMController::signal_anti_pgm(AntiPGMController *this)

{
  mutex *__mutex;
  list<core::P<r_exec::Overlay>_> *this_00;
  InputLessPGMOverlay *this_01;
  atomic_int_fast64_t *paVar1;
  int iVar2;
  InputLessPGMOverlay *in_RAX;
  P<r_exec::Overlay> local_28;
  
  __mutex = &(this->super__PGMController).super_OController.super_Controller.m_reductionMutex;
  local_28.object = (_Object *)in_RAX;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    if ((this->super__PGMController).field_0x99 == '\x01') {
      (this->super__PGMController).field_0x99 = 0;
    }
    else {
      this_01 = (InputLessPGMOverlay *)
                (this->super__PGMController).super_OController.overlays.cells.
                super__Vector_base<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start
                [(this->super__PGMController).super_OController.overlays.used_cells_head].data.
                object;
      InputLessPGMOverlay::inject_productions(this_01);
      (*(this_01->super_Overlay).super__Object._vptr__Object[2])(this_01);
      if ((((this->super__PGMController).run_once == false) &&
          ((this->super__PGMController).super_OController.super_Controller.invalidated == 0)) &&
         ((this->super__PGMController).super_OController.super_Controller.activated == 1)) {
        this_00 = &(this->super__PGMController).super_OController.overlays;
        *(undefined4 *)&(this->super__PGMController).super_OController.overlays.used_cells_head =
             0xffffffff;
        *(undefined4 *)
         ((long)&(this->super__PGMController).super_OController.overlays.used_cells_head + 4) =
             0xffffffff;
        *(undefined4 *)&(this->super__PGMController).super_OController.overlays.used_cells_tail =
             0xffffffff;
        *(undefined4 *)
         ((long)&(this->super__PGMController).super_OController.overlays.used_cells_tail + 4) =
             0xffffffff;
        (this->super__PGMController).super_OController.overlays.free_cells = -1;
        (this->super__PGMController).super_OController.overlays.used_cell_count = 0;
        (this->super__PGMController).super_OController.overlays.free_cell_count = 0;
        std::
        vector<r_code::list<core::P<r_exec::Overlay>_>::cell,_std::allocator<r_code::list<core::P<r_exec::Overlay>_>::cell>_>
        ::clear(&this_00->cells);
        LOCK();
        paVar1 = &(this_01->super_Overlay).super__Object.refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
        UNLOCK();
        local_28.object = (_Object *)this_01;
        r_code::list<core::P<r_exec::Overlay>_>::push_back(this_00,&local_28);
        if ((InputLessPGMOverlay *)local_28.object != (InputLessPGMOverlay *)0x0) {
          LOCK();
          ((local_28.object)->refCount).super___atomic_base<long>._M_i =
               ((local_28.object)->refCount).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if (((local_28.object)->refCount).super___atomic_base<long>._M_i < 1) {
            (*(((Overlay *)&(local_28.object)->_vptr__Object)->super__Object)._vptr__Object[1])();
          }
        }
      }
    }
    if ((this->super__PGMController).run_once == true) {
      (*(this->super__PGMController).super_OController.super_Controller.super__Object._vptr__Object
        [3])(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void AntiPGMController::signal_anti_pgm()
{
    std::lock_guard<std::mutex> guard(m_reductionMutex);

    if (successful_match) { // a signaling job has been spawn in restart(): we are here in an old job during which a positive match occurred: do nothing.
        successful_match = false;
    } else { // no positive match during this job: inject productions and restart.
        Overlay *overlay = overlays.front();
        ((AntiPGMOverlay *)overlay)->inject_productions();
        overlay->reset(); // reset the first overlay and kill all others.

        if (!run_once && is_alive()) {
            overlays.clear();
            overlays.push_back(overlay);
        }
    }

    if (run_once) {
        invalidate();
    }
}